

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator::IfcCartesianTransformationOperator
          (IfcCartesianTransformationOperator *this,void **vtt)

{
  void **vtt_local;
  IfcCartesianTransformationOperator *this_local;
  
  IfcGeometricRepresentationItem::IfcGeometricRepresentationItem
            (&this->super_IfcGeometricRepresentationItem,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator,_4UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator,_4UL> *)
             &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20,
             vtt + 10);
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                  _vptr_ObjectHelper[-3]) = vtt[0xc];
  *(void **)&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0xd];
  *(void **)&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0xe];
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Maybe
            ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_> *)
             &(this->super_IfcGeometricRepresentationItem).field_0x30);
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Maybe(&this->Axis2);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>::Lazy(&this->LocalOrigin,(LazyObject *)0x0)
  ;
  STEP::Maybe<double>::Maybe(&this->Scale);
  return;
}

Assistant:

IfcCartesianTransformationOperator() : Object("IfcCartesianTransformationOperator") {}